

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O2

bool __thiscall tl::CStrT<char>::operator==(CStrT<char> *this,char *o)

{
  char cVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    cVar1 = this->_str[lVar2];
    if ((cVar1 == '\0') || (cVar1 != o[lVar2])) break;
    lVar2 = lVar2 + 1;
  }
  return cVar1 == o[lVar2];
}

Assistant:

bool CStrT<CharT>::operator==(const CharT* o)const
{
    const CharT* a = _str;
    const CharT* b = o;
    while(true) {
        if(*a != *b)
            return false;
        if(*a == 0)
            return true;
        a++;
        b++;
    }
}